

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O1

void * CRYPTO_get_thread_local(thread_local_data_t index)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = pthread_once(&g_thread_local_init_once,thread_local_init);
  if (iVar1 != 0) {
    abort();
  }
  if ((g_thread_local_key_created != 0) &&
     (pvVar2 = pthread_getspecific(g_thread_local_key), pvVar2 != (void *)0x0)) {
    return *(void **)((long)pvVar2 + (ulong)index * 8);
  }
  return (void *)0x0;
}

Assistant:

void *CRYPTO_get_thread_local(thread_local_data_t index) {
  CRYPTO_once(&g_thread_local_init_once, thread_local_init);
  if (!g_thread_local_key_created) {
    return NULL;
  }

  void **pointers =
      reinterpret_cast<void **>(pthread_getspecific(g_thread_local_key));
  if (pointers == NULL) {
    return NULL;
  }
  return pointers[index];
}